

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

QItemSelection * __thiscall
QAbstractProxyModel::mapSelectionFromSource
          (QItemSelection *__return_storage_ptr__,QAbstractProxyModel *this,
          QItemSelection *sourceSelection)

{
  undefined1 *puVar1;
  long lVar2;
  long in_FS_OFFSET;
  QItemSelectionRange local_88;
  QModelIndex local_78;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::indexes((QModelIndexList *)&local_58,sourceSelection);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  lVar2 = 0;
  for (puVar1 = (undefined1 *)0x0; puVar1 < (ulong)local_58.size; puVar1 = puVar1 + 1) {
    local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.r = -0x55555556;
    local_78.c = -0x55555556;
    local_78.i._0_4_ = 0xaaaaaaaa;
    local_78.i._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this + 0x198))
              (&local_78,this,(undefined1 *)((long)&(local_58.ptr)->r + lVar2));
    if (((-1 < local_78.r) && (-1 < local_78.c)) && (local_78.m.ptr != (QAbstractItemModel *)0x0)) {
      QItemSelectionRange::QItemSelectionRange(&local_88,&local_78);
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                (&__return_storage_ptr__->super_QList<QItemSelectionRange>,&local_88);
      QItemSelectionRange::~QItemSelectionRange(&local_88);
    }
    lVar2 = lVar2 + 0x18;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelection QAbstractProxyModel::mapSelectionFromSource(const QItemSelection &sourceSelection) const
{
    QModelIndexList sourceIndexes = sourceSelection.indexes();
    QItemSelection proxySelection;
    for (int i = 0; i < sourceIndexes.size(); ++i) {
        const QModelIndex srcIdx = mapFromSource(sourceIndexes.at(i));
        if (!srcIdx.isValid())
            continue;
        proxySelection << QItemSelectionRange(srcIdx);
    }
    return proxySelection;
}